

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

void nni_sha1_process(nni_sha1_ctx *ctx)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int t;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  int t_1;
  uint uVar14;
  int t_4;
  uint uVar15;
  int iVar16;
  int t_2;
  uint uVar17;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [5];
  uint W [80];
  
  for (lVar8 = 8; lVar8 != 0x18; lVar8 = lVar8 + 1) {
    uVar9 = ctx->digest[lVar8];
    auStack_198[lVar8] =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  }
  for (lVar8 = 0x10; lVar8 != 0x50; lVar8 = lVar8 + 1) {
    uVar9 = auStack_198[lVar8] ^ auStack_184[lVar8] ^ auStack_1b8[lVar8 + 2] ^ auStack_1b8[lVar8];
    auStack_184[lVar8 + 3] = uVar9 << 1 | (uint)((int)uVar9 < 0);
  }
  uVar1 = ctx->digest[1];
  uVar2 = ctx->digest[2];
  uVar3 = ctx->digest[3];
  uVar9 = ctx->digest[4];
  uVar6 = uVar3;
  uVar13 = uVar9;
  uVar7 = ctx->digest[0];
  uVar12 = uVar1;
  uVar17 = uVar2;
  for (lVar8 = 0; uVar15 = uVar7, uVar10 = uVar6, lVar8 != 0x14; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar16 = (uVar15 << 5 | uVar15 >> 0x1b) + uVar13;
    uVar14 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar6 = uVar17;
    uVar13 = uVar10;
    uVar7 = iVar16 + ((uVar17 ^ uVar10) & uVar12 ^ uVar10) + auStack_184[lVar5] + 0x5a827999;
    uVar12 = uVar15;
    uVar17 = uVar14 | uVar4;
  }
  for (lVar8 = 0x14; uVar14 = uVar17, lVar8 != 0x28; lVar8 = lVar8 + 1) {
    lVar5 = lVar8 + 3;
    iVar16 = (uVar14 ^ uVar12 ^ uVar10) + (uVar15 << 5 | uVar15 >> 0x1b) + uVar13;
    uVar17 = uVar12 << 0x1e | uVar12 >> 2;
    uVar13 = uVar10;
    uVar12 = uVar15;
    uVar15 = iVar16 + auStack_184[lVar5] + 0x6ed9eba1;
    uVar10 = uVar14;
  }
  for (lVar8 = 0x28; lVar8 != 0x3c; lVar8 = lVar8 + 1) {
    uVar11 = (uVar10 | uVar14) & uVar12;
    lVar5 = lVar8 + 3;
    iVar16 = (uVar15 << 5 | uVar15 >> 0x1b) + uVar13;
    uVar17 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    uVar13 = uVar10;
    uVar12 = uVar15;
    uVar15 = auStack_184[lVar5] + iVar16 + (uVar10 & uVar14 | uVar11) + 0x8f1bbcdc;
    uVar10 = uVar14;
    uVar14 = uVar17 | uVar4;
  }
  lVar8 = 0x3c;
  while( true ) {
    if (lVar8 == 0x50) break;
    lVar5 = lVar8 + 3;
    iVar16 = (uVar14 ^ uVar12 ^ uVar10) + (uVar15 << 5 | uVar15 >> 0x1b) + uVar13;
    uVar17 = uVar12 << 0x1e;
    uVar4 = uVar12 >> 2;
    lVar8 = lVar8 + 1;
    uVar13 = uVar10;
    uVar12 = uVar15;
    uVar15 = auStack_184[lVar5] + iVar16 + 0xca62c1d6;
    uVar10 = uVar14;
    uVar14 = uVar17 | uVar4;
  }
  ctx->digest[0] = uVar15 + ctx->digest[0];
  ctx->digest[1] = uVar12 + uVar1;
  ctx->digest[2] = uVar14 + uVar2;
  ctx->digest[3] = uVar10 + uVar3;
  ctx->digest[4] = uVar13 + uVar9;
  ctx->idx = 0;
  return;
}

Assistant:

void
nni_sha1_process(nni_sha1_ctx *ctx)
{
	const unsigned K[] = // Constants defined in SHA-1
	    { 0x5A827999, 0x6ED9EBA1, 0x8F1BBCDC, 0xCA62C1D6 };
	unsigned temp;          // Temporary word value
	unsigned W[80];         // Word sequence
	unsigned A, B, C, D, E; // Word buffers

	// Initialize the first 16 words in the array W
	for (int t = 0; t < 16; t++) {
		W[t] = ((unsigned) ctx->blk[t * 4]) << 24;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 1]) << 16;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 2]) << 8;
		W[t] |= ((unsigned) ctx->blk[t * 4 + 3]);
	}

	for (int t = 16; t < 80; t++) {
		W[t] = nni_sha1_circular_shift(
		    1, W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16]);
	}

	A = ctx->digest[0];
	B = ctx->digest[1];
	C = ctx->digest[2];
	D = ctx->digest[3];
	E = ctx->digest[4];

	for (int t = 0; t < 20; t++) {
		temp = nni_sha1_circular_shift(5, A) + ((B & C) | ((~B) & D)) +
		    E + W[t] + K[0];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 20; t < 40; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[1];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 40; t < 60; t++) {
		temp = nni_sha1_circular_shift(5, A) +
		    ((B & C) | (B & D) | (C & D)) + E + W[t] + K[2];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	for (int t = 60; t < 80; t++) {
		temp = nni_sha1_circular_shift(5, A) + (B ^ C ^ D) + E + W[t] +
		    K[3];
		temp &= 0xFFFFFFFF;
		E = D;
		D = C;
		C = nni_sha1_circular_shift(30, B);
		B = A;
		A = temp;
	}

	ctx->digest[0] = (ctx->digest[0] + A) & 0xFFFFFFFF;
	ctx->digest[1] = (ctx->digest[1] + B) & 0xFFFFFFFF;
	ctx->digest[2] = (ctx->digest[2] + C) & 0xFFFFFFFF;
	ctx->digest[3] = (ctx->digest[3] + D) & 0xFFFFFFFF;
	ctx->digest[4] = (ctx->digest[4] + E) & 0xFFFFFFFF;

	ctx->idx = 0;
}